

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constant_folding.cpp
# Opt level: O2

void skiwi::anon_unknown_26::fold_fxlog(PrimitiveCall *p,Expression *e)

{
  Expression *e_00;
  bool bVar1;
  Fixnum f1;
  Literal lit1;
  undefined1 local_110 [40];
  _Alloc_hider local_e8;
  size_type local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  _Variadic_union<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>
  local_c8;
  undefined1 local_68;
  undefined1 local_60 [40];
  _Alloc_hider local_38;
  size_type local_30;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_28;
  
  e_00 = (p->arguments).
         super__Vector_base<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
  if ((long)(p->arguments).
            super__Vector_base<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
            ._M_impl.super__Vector_impl_data._M_finish - (long)e_00 == 0xf0) {
    local_c8._32_8_ = local_c8._M_first._M_storage._M_storage + 0x30;
    local_c8._0_8_ = 0xffffffffffffffff;
    local_c8._M_first._M_storage._M_storage[9] = '\0';
    local_c8._16_8_ = 0;
    local_c8._24_8_ = 0;
    local_c8._40_8_ = 0;
    local_c8._M_first._M_storage._M_storage[0x30] = '\0';
    local_68 = 0;
    local_110._0_4_ = -1;
    local_110._4_4_ = -1;
    local_110[0x10] = false;
    local_e8._M_p = (pointer)&local_d8;
    local_110._24_8_ = 0;
    local_110._32_8_ = 0;
    local_e0 = 0;
    local_d8._M_local_buf[0] = '\0';
    bVar1 = is_literal((Literal *)&local_c8._M_first,e_00);
    if (bVar1) {
      bVar1 = is_fixnum((Fixnum *)local_110,(Literal *)&local_c8._M_first);
      if (bVar1) {
        local_60._8_8_ = log((double)(long)local_110._8_8_);
        local_60._0_4_ = -1;
        local_60._4_4_ = -1;
        local_60[0x10] = false;
        local_38._M_p = (pointer)&local_28;
        local_60._24_8_ = 0;
        local_60._32_8_ = 0;
        local_30 = 0;
        local_28._M_local_buf[0] = '\0';
        std::
        variant<skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
        ::operator=((variant<skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
                     *)e,(Flonum *)local_60);
        std::__cxx11::string::~string((string *)&local_38);
      }
    }
    std::__cxx11::string::~string((string *)&local_e8);
    std::__detail::__variant::
    _Variant_storage<false,_skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>
    ::~_Variant_storage((_Variant_storage<false,_skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>
                         *)&local_c8._M_first);
    return;
  }
  __assert_fail("p.arguments.size() == 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi/constant_folding.cpp"
                ,0x3a4,
                "void skiwi::(anonymous namespace)::fold_fxlog(PrimitiveCall &, Expression &)");
}

Assistant:

void fold_fxlog(PrimitiveCall& p, Expression& e)
    {
    assert(p.arguments.size() == 1);
    Literal lit1;
    Fixnum f1;
    if (is_literal(lit1, p.arguments[0]))
      {
      if (is_fixnum(f1, lit1))
        {
        e = make_flonum(std::log((double)f1.value));
        }
      }
    }